

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O2

void __thiscall tetgenmesh::bond(tetgenmesh *this,triface *t1,triface *t2)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = t1->ver;
  uVar2 = t2->ver;
  t1->tet[uVar1 & 3] = (tetrahedron)((long)bondtbl[(int)uVar1][(int)uVar2] | (ulong)t2->tet);
  t2->tet[uVar2 & 3] = (tetrahedron)((long)bondtbl[(int)uVar2][(int)uVar1] | (ulong)t1->tet);
  return;
}

Assistant:

inline void tetgenmesh::bond(triface& t1, triface& t2) {
  t1.tet[t1.ver & 3] = encode2(t2.tet, bondtbl[t1.ver][t2.ver]);
  t2.tet[t2.ver & 3] = encode2(t1.tet, bondtbl[t2.ver][t1.ver]);
}